

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

module_ __thiscall pybind11::module_::def_submodule(module_ *this,char *name,char *doc)

{
  char *__s;
  PyObject *pPVar1;
  char *in_RCX;
  string full_name;
  allocator<char> local_c3;
  allocator<char> local_c2;
  allocator<char> local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_a0 [16];
  undefined1 local_90 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  __s = (char *)PyModule_GetName(*(undefined8 *)name);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,__s,&local_c1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,".",&local_c2);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                 &local_c0,&local_60);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,doc,&local_c3);
  std::operator+(&local_40,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                 &local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_c0);
  pPVar1 = (PyObject *)PyImport_AddModule(local_40._M_dataplus._M_p);
  (this->super_object).super_handle.m_ptr = pPVar1;
  if (pPVar1 != (PyObject *)0x0) {
    pPVar1->ob_refcnt = pPVar1->ob_refcnt + 1;
  }
  if ((in_RCX != (char *)0x0) && (options::global_state()::instance == '\x01')) {
    str::str((str *)&local_c0,in_RCX);
    local_a0._8_8_ = (this->super_object).super_handle.m_ptr;
    local_90._0_8_ = "__doc__";
    local_90._8_8_ = 0;
    detail::accessor<pybind11::detail::accessor_policies::str_attr>::operator=
              ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_a0,(str *)&local_c0)
    ;
    object::~object((object *)(local_90 + 8));
    object::~object((object *)&local_c0);
  }
  local_a0._8_8_ = *(undefined8 *)name;
  local_90._8_8_ = 0;
  local_90._0_8_ = doc;
  detail::accessor<pybind11::detail::accessor_policies::str_attr>::operator=
            ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_a0,this);
  object::~object((object *)(local_90 + 8));
  std::__cxx11::string::~string((string *)&local_40);
  return (object)(object)this;
}

Assistant:

module_ def_submodule(const char *name, const char *doc = nullptr) {
        std::string full_name = std::string(PyModule_GetName(m_ptr))
            + std::string(".") + std::string(name);
        auto result = reinterpret_borrow<module_>(PyImport_AddModule(full_name.c_str()));
        if (doc && options::show_user_defined_docstrings())
            result.attr("__doc__") = pybind11::str(doc);
        attr(name) = result;
        return result;
    }